

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTailIdx.cpp
# Opt level: O1

void __thiscall liblogger::LogTailIdx::Log(LogTailIdx *this,LogType Type,string *str)

{
  pointer pcVar1;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  LogManager::Lock();
  local_40 = (undefined1  [8])this->m_current;
  pcVar1 = (str->_M_dataplus)._M_p;
  local_38._M_p = (pointer)&local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + str->_M_string_length);
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<unsigned_long,std::__cxx11::string>>
            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
              *)&this->m_data,
             (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_p != &local_28) {
    operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
  }
  this->m_current = this->m_current + 1;
  if (this->m_length <= (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                        *)&this->m_data,
                       (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  LogManager::Unlock();
  return;
}

Assistant:

void LogTailIdx::Log(const LogType Type, const std::string &str) {
	LogManagerScopedLock lock = LogManagerScopedLock();
	m_data.insert(std::make_pair(m_current, str));
	m_current++;
	if (m_data.size() >= m_length)
	{
		m_data.erase(m_data.begin());
	}
}